

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getOverflowPage(BtShared *pBt,Pgno ovfl,MemPage **ppPage,Pgno *pPgnoNext)

{
  Pgno PVar1;
  Pgno PVar2;
  bool bVar3;
  Pgno local_54;
  u8 local_45;
  Pgno local_44;
  Pgno PStack_40;
  u8 eType;
  Pgno iGuess;
  Pgno pgno;
  int rc;
  MemPage *pPage;
  Pgno *pPStack_28;
  Pgno next;
  Pgno *pPgnoNext_local;
  MemPage **ppPage_local;
  BtShared *pBStack_10;
  Pgno ovfl_local;
  BtShared *pBt_local;
  
  pPage._4_4_ = 0;
  _pgno = (MemPage *)0x0;
  iGuess = 0;
  pPStack_28 = pPgnoNext;
  pPgnoNext_local = (Pgno *)ppPage;
  ppPage_local._4_4_ = ovfl;
  pBStack_10 = pBt;
  if (pBt->autoVacuum != '\0') {
    local_44 = ovfl + 1;
    while( true ) {
      PVar2 = ptrmapPageno(pBStack_10,local_44);
      PVar1 = local_44;
      bVar3 = true;
      if (PVar2 != local_44) {
        bVar3 = local_44 == (uint)sqlite3PendingByte / pBStack_10->pageSize + 1;
      }
      if (!bVar3) break;
      local_44 = local_44 + 1;
    }
    PVar2 = btreePagecount(pBStack_10);
    if ((((PVar1 <= PVar2) &&
         (iGuess = ptrmapGet(pBStack_10,local_44,&local_45,&stack0xffffffffffffffc0), iGuess == 0))
        && (local_45 == '\x04')) && (PStack_40 == ppPage_local._4_4_)) {
      pPage._4_4_ = local_44;
      iGuess = 0x65;
    }
  }
  if ((iGuess == 0) &&
     (iGuess = btreeGetPage(pBStack_10,ppPage_local._4_4_,(MemPage **)&pgno,0,
                            (uint)(pPgnoNext_local == (Pgno *)0x0)), iGuess == 0)) {
    pPage._4_4_ = sqlite3Get4byte(_pgno->aData);
  }
  *pPStack_28 = pPage._4_4_;
  if (pPgnoNext_local == (Pgno *)0x0) {
    releasePage(_pgno);
  }
  else {
    *(MemPage **)pPgnoNext_local = _pgno;
  }
  if (iGuess == 0x65) {
    local_54 = 0;
  }
  else {
    local_54 = iGuess;
  }
  return local_54;
}

Assistant:

static int getOverflowPage(
  BtShared *pBt,               /* The database file */
  Pgno ovfl,                   /* Current overflow page number */
  MemPage **ppPage,            /* OUT: MemPage handle (may be NULL) */
  Pgno *pPgnoNext              /* OUT: Next overflow page number */
){
  Pgno next = 0;
  MemPage *pPage = 0;
  int rc = SQLITE_OK;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert(pPgnoNext);

#ifndef SQLITE_OMIT_AUTOVACUUM
  /* Try to find the next page in the overflow list using the
  ** autovacuum pointer-map pages. Guess that the next page in 
  ** the overflow list is page number (ovfl+1). If that guess turns 
  ** out to be wrong, fall back to loading the data of page 
  ** number ovfl to determine the next page number.
  */
  if( pBt->autoVacuum ){
    Pgno pgno;
    Pgno iGuess = ovfl+1;
    u8 eType;

    while( PTRMAP_ISPAGE(pBt, iGuess) || iGuess==PENDING_BYTE_PAGE(pBt) ){
      iGuess++;
    }

    if( iGuess<=btreePagecount(pBt) ){
      rc = ptrmapGet(pBt, iGuess, &eType, &pgno);
      if( rc==SQLITE_OK && eType==PTRMAP_OVERFLOW2 && pgno==ovfl ){
        next = iGuess;
        rc = SQLITE_DONE;
      }
    }
  }
#endif

  assert( next==0 || rc==SQLITE_DONE );
  if( rc==SQLITE_OK ){
    rc = btreeGetPage(pBt, ovfl, &pPage, 0, (ppPage==0));
    assert( rc==SQLITE_OK || pPage==0 );
    if( rc==SQLITE_OK ){
      next = get4byte(pPage->aData);
    }
  }

  *pPgnoNext = next;
  if( ppPage ){
    *ppPage = pPage;
  }else{
    releasePage(pPage);
  }
  return (rc==SQLITE_DONE ? SQLITE_OK : rc);
}